

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::removeBall(Map *this,int n)

{
  Ball *pBVar1;
  int i;
  long lVar2;
  
  if (this->ball[n] != (Ball *)0x0) {
    lVar2 = 0;
    do {
      pBVar1 = this->palette->dockedBalls[lVar2];
      if ((pBVar1 != (Ball *)0x0) && (pBVar1 == this->ball[n])) {
        this->palette->dockedBalls[lVar2] = (Ball *)0x0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x1e);
    operator_delete(this->ball[n],0x14);
    this->ball[n] = (Ball *)0x0;
    this->balls = this->balls + -1;
  }
  return;
}

Assistant:

void Map::removeBall(int n){
    if(ball[n]){
        for(int i=0; i<MAX_BALLS; i++){
            if(palette->dockedBalls[i] && palette->dockedBalls[i] == ball[n]){
                palette->dockedBalls[i] = nullptr;
            }
        }

        delete(ball[n]);
        ball[n] = nullptr;
        balls--;
    }
}